

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

FiniteAutomaton *
Omega_h::FiniteAutomaton::maybe
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,int token)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int to_state;
  int at_symbol;
  int iVar4;
  int iVar5;
  int i;
  
  iVar3 = (a->table).ncols;
  bVar1 = a->is_deterministic;
  iVar2 = get_nrows<int>(&a->table);
  FiniteAutomaton(__return_storage_ptr__,iVar3 + (uint)bVar1 * 2 + -2,false,iVar2 + 2);
  iVar3 = add_state(__return_storage_ptr__);
  iVar2 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,a);
  to_state = add_state(__return_storage_ptr__);
  at_symbol = get_epsilon0(__return_storage_ptr__);
  iVar4 = get_epsilon1(__return_storage_ptr__);
  add_transition(__return_storage_ptr__,iVar3,iVar4,iVar2);
  for (iVar4 = 0; iVar5 = get_nrows<int>(&a->table), iVar4 < iVar5; iVar4 = iVar4 + 1) {
    iVar5 = accepts(a,iVar4);
    if (iVar5 != -1) {
      iVar5 = iVar2 + iVar4;
      add_transition(__return_storage_ptr__,iVar3,at_symbol,iVar5);
      remove_accept(__return_storage_ptr__,iVar5);
      iVar3 = iVar5;
    }
  }
  add_transition(__return_storage_ptr__,iVar3,at_symbol,to_state);
  add_accept(__return_storage_ptr__,to_state,token);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::maybe(FiniteAutomaton const& a, int token) {
  FiniteAutomaton out(get_nsymbols(a), false, get_nstates(a) + 2);
  auto new_start_state = add_state(out);
  auto offset = get_nstates(out);
  append_states(out, a);
  auto new_accept_state = add_state(out);
  auto epsilon0 = get_epsilon0(out);
  auto epsilon1 = get_epsilon1(out);
  add_transition(out, new_start_state, epsilon1, offset);
  /* form an epsilon0 linked list of new start state,
     all old accepting states, and new accepting state */
  auto last = new_start_state;
  for (int i = 0; i < get_nstates(a); ++i) {
    if (accepts(a, i) != -1) {
      add_transition(out, last, epsilon0, i + offset);
      remove_accept(out, i + offset);
      last = i + offset;
    }
  }
  add_transition(out, last, epsilon0, new_accept_state);
  add_accept(out, new_accept_state, token);
  return out;
}